

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

EnumValueDescriptor * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetEnum
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  int key;
  ExtensionSet *this_00;
  int *piVar1;
  EnumValueDescriptor *pEVar2;
  LogMessage *pLVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetEnum","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetEnum",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 8) {
    anon_unknown_0::ReportReflectionUsageTypeError(this->descriptor_,field,"GetEnum",CPPTYPE_ENUM);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    this_00 = GetExtensionSet(this,message);
    key = ExtensionSet::GetEnum
                    (this_00,*(int *)(field + 0x28),*(int *)(*(long *)(field + 0x70) + 0x10));
  }
  else {
    piVar1 = GetRaw<int>(this,message,field);
    key = *piVar1;
  }
  pEVar2 = EnumDescriptor::FindValueByNumber(*(EnumDescriptor **)(field + 0x50),key);
  if (pEVar2 == (EnumValueDescriptor *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
               ,0x38d);
    pLVar3 = LogMessage::operator<<(&local_58,"CHECK failed: result != NULL: ");
    pLVar3 = LogMessage::operator<<(pLVar3,"Value ");
    pLVar3 = LogMessage::operator<<(pLVar3,key);
    pLVar3 = LogMessage::operator<<(pLVar3," is not valid for field ");
    pLVar3 = LogMessage::operator<<(pLVar3,*(string **)(field + 8));
    pLVar3 = LogMessage::operator<<(pLVar3," of type ");
    pLVar3 = LogMessage::operator<<(pLVar3,*(string **)(*(long *)(field + 0x50) + 8));
    pLVar3 = LogMessage::operator<<(pLVar3,".");
    LogFinisher::operator=(&local_59,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  return pEVar2;
}

Assistant:

const EnumValueDescriptor* GeneratedMessageReflection::GetEnum(
    const Message& message, const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetEnum, SINGULAR, ENUM);

  int value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetEnum(
      field->number(), field->default_value_enum()->number());
  } else {
    value = GetField<int>(message, field);
  }
  const EnumValueDescriptor* result =
    field->enum_type()->FindValueByNumber(value);
  GOOGLE_CHECK(result != NULL) << "Value " << value << " is not valid for field "
                        << field->full_name() << " of type "
                        << field->enum_type()->full_name() << ".";
  return result;
}